

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

UBool __thiscall icu_63::PatternMap::equals(PatternMap *this,PatternMap *other)

{
  ushort uVar1;
  short sVar2;
  PtnSkeleton *this_00;
  PtnSkeleton *other_00;
  UBool UVar3;
  int iVar4;
  PtnElem *pPVar5;
  int iVar6;
  ulong uVar7;
  PtnElem *pPVar8;
  bool bVar9;
  bool bVar10;
  
  if (this == other) {
    bVar9 = true;
  }
  else {
    uVar7 = 0;
    bVar9 = false;
    do {
      pPVar8 = this->boot[uVar7];
      pPVar5 = other->boot[uVar7];
      if (pPVar8 != pPVar5) {
        if (pPVar8 == (PtnElem *)0x0) {
          return bVar9;
        }
        if (pPVar5 == (PtnElem *)0x0) {
          return bVar9;
        }
        if (pPVar8 != pPVar5) {
          do {
            if (pPVar5 == (PtnElem *)0x0) {
              return bVar9;
            }
            if (pPVar8 == (PtnElem *)0x0) {
              return bVar9;
            }
            uVar1 = (pPVar8->basePattern).fUnion.fStackFields.fLengthAndFlags;
            if ((uVar1 & 1) == 0) {
              if ((short)uVar1 < 0) {
                iVar4 = (pPVar8->basePattern).fUnion.fFields.fLength;
              }
              else {
                iVar4 = (int)(short)uVar1 >> 5;
              }
              sVar2 = (pPVar5->basePattern).fUnion.fStackFields.fLengthAndFlags;
              if (sVar2 < 0) {
                iVar6 = (pPVar5->basePattern).fUnion.fFields.fLength;
              }
              else {
                iVar6 = (int)sVar2 >> 5;
              }
              bVar10 = false;
              if ((((int)sVar2 & 1U) == 0) && (bVar10 = false, iVar4 == iVar6)) {
                UVar3 = icu_63::UnicodeString::doEquals
                                  (&pPVar8->basePattern,&pPVar5->basePattern,iVar4);
                bVar10 = UVar3 != '\0';
              }
            }
            else {
              bVar10 = (bool)(*(byte *)&(pPVar5->basePattern).fUnion & 1);
            }
            if (bVar10 == false) {
              return bVar9;
            }
            uVar1 = (pPVar8->pattern).fUnion.fStackFields.fLengthAndFlags;
            if ((uVar1 & 1) == 0) {
              if ((short)uVar1 < 0) {
                iVar4 = (pPVar8->pattern).fUnion.fFields.fLength;
              }
              else {
                iVar4 = (int)(short)uVar1 >> 5;
              }
              sVar2 = (pPVar5->pattern).fUnion.fStackFields.fLengthAndFlags;
              if (sVar2 < 0) {
                iVar6 = (pPVar5->pattern).fUnion.fFields.fLength;
              }
              else {
                iVar6 = (int)sVar2 >> 5;
              }
              bVar10 = false;
              if ((((int)sVar2 & 1U) == 0) && (bVar10 = false, iVar4 == iVar6)) {
                UVar3 = icu_63::UnicodeString::doEquals(&pPVar8->pattern,&pPVar5->pattern,iVar4);
                bVar10 = UVar3 != '\0';
              }
            }
            else {
              bVar10 = (bool)(*(byte *)&(pPVar5->pattern).fUnion & 1);
            }
            if (bVar10 == false) {
              return bVar9;
            }
            this_00 = (pPVar8->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
            other_00 = (pPVar5->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
            if ((this_00 != other_00) &&
               (UVar3 = PtnSkeleton::equals(this_00,other_00), UVar3 == '\0')) {
              return bVar9;
            }
            pPVar8 = (pPVar8->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
            pPVar5 = (pPVar5->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
          } while ((pPVar8 != pPVar5) && (pPVar5 != (PtnElem *)0x0 || pPVar8 != (PtnElem *)0x0));
        }
      }
      bVar9 = 0x32 < uVar7;
      uVar7 = uVar7 + 1;
    } while (uVar7 != 0x34);
  }
  return bVar9;
}

Assistant:

UBool
PatternMap::equals(const PatternMap& other) const {
    if ( this==&other ) {
        return TRUE;
    }
    for (int32_t bootIndex = 0; bootIndex < MAX_PATTERN_ENTRIES; ++bootIndex) {
        if (boot[bootIndex] == other.boot[bootIndex]) {
            continue;
        }
        if ((boot[bootIndex] == nullptr) || (other.boot[bootIndex] == nullptr)) {
            return FALSE;
        }
        PtnElem *otherElem = other.boot[bootIndex];
        PtnElem *myElem = boot[bootIndex];
        while ((otherElem != nullptr) || (myElem != nullptr)) {
            if ( myElem == otherElem ) {
                break;
            }
            if ((otherElem == nullptr) || (myElem == nullptr)) {
                return FALSE;
            }
            if ( (myElem->basePattern != otherElem->basePattern) ||
                 (myElem->pattern != otherElem->pattern) ) {
                return FALSE;
            }
            if ((myElem->skeleton.getAlias() != otherElem->skeleton.getAlias()) &&
                !myElem->skeleton->equals(*(otherElem->skeleton))) {
                return FALSE;
            }
            myElem = myElem->next.getAlias();
            otherElem = otherElem->next.getAlias();
        }
    }
    return TRUE;
}